

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O1

string * __thiscall
onmt::unicode::cp_to_utf8_abi_cxx11_(string *__return_storage_ptr__,unicode *this,code_point_t uc)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  uint uVar4;
  uint8_t s [4];
  byte local_c [4];
  
  pbVar3 = &stack0xfffffffffffffff8;
  uVar4 = (uint)this;
  if (uVar4 < 0x80) {
    pbVar3 = local_c + 1;
  }
  else {
    if (uVar4 < 0x800) {
      pbVar3 = local_c + 2;
      bVar2 = (byte)((ulong)this >> 6) | 0xc0;
    }
    else {
      if (uVar4 < 0xd800 || (uVar4 & 0xffffe000) == 0xe000) {
        pbVar3 = local_c + 3;
        bVar2 = (byte)((ulong)this >> 0xc) | 0xe0;
      }
      else {
        if (0xfffff < uVar4 - 0x10000) {
          pbVar3 = local_c;
          bVar1 = false;
          goto LAB_001b9b54;
        }
        local_c[0] = (byte)((ulong)this >> 0x12) | 0xf0;
        bVar2 = (byte)((ulong)this >> 0xc) & 0x3f | 0x80;
      }
      pbVar3[-3] = bVar2;
      bVar2 = (byte)((ulong)this >> 6) & 0x3f | 0x80;
    }
    pbVar3[-2] = bVar2;
    this = (unicode *)(ulong)((byte)this & 0x3f | 0x80);
  }
  pbVar3[-1] = (byte)this;
  bVar1 = true;
LAB_001b9b54:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,local_c,pbVar3)
    ;
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cp_to_utf8(code_point_t uc)
    {
      uint8_t s[U8_MAX_LENGTH];
      int32_t offset = 0;
      UBool error = false;
      U8_APPEND(s, offset, U8_MAX_LENGTH, uc, error);
      if (error)
        return std::string();
      return std::string(reinterpret_cast<std::string::value_type*>(s), offset);
    }